

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O2

void drawInmateSelection(Windows *win,Map *map,UnitList *inmates,UnitList *guards)

{
  InmateType IVar1;
  char cVar2;
  int iVar3;
  Inmate *unit;
  char *pcVar4;
  int iVar5;
  WINDOW *pWVar6;
  int iVar7;
  
  iVar5 = 0;
  do {
    updateHeader(win->header,map);
    wrefresh(win->header);
    cVar2 = wgetch(win->body);
    switch(cVar2) {
    case 'a':
      pWVar6 = win->footer;
      if (map->repMax < 0x1e) break;
      mvwprintw(pWVar6,0,0x28,"ATTORNEY ADDED");
      unit = createInmate(ATTORNEY);
      map->repMax = map->repMax + -0x1e;
LAB_00103317:
      enqueue(inmates,unit);
      iVar5 = iVar5 + 1;
      updateQueue(win->body,inmates,iVar5);
      goto LAB_0010334d;
    case 'b':
      pWVar6 = win->footer;
      if (0xf < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"BRUISER ADDED");
        IVar1 = BRUISER;
LAB_00103240:
        unit = createInmate(IVar1);
        map->repMax = map->repMax + -0x10;
        goto LAB_00103317;
      }
      break;
    case 'c':
      pWVar6 = win->footer;
      if (0x13 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"CUTIE ADDED");
        unit = createInmate(CUTIE);
        map->repMax = map->repMax + -0x14;
        goto LAB_00103317;
      }
      break;
    case 'd':
      pWVar6 = win->footer;
      if (9 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"DOCTOR ADDED");
        IVar1 = DOCTOR;
LAB_001032d6:
        unit = createInmate(IVar1);
        map->repMax = map->repMax + -10;
        goto LAB_00103317;
      }
      break;
    default:
      pWVar6 = win->footer;
      pcVar4 = "INMATE NOT FOUND";
      goto LAB_00103346;
    case 'f':
      pWVar6 = win->footer;
      if (0x3b < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"FATTY ADDED");
        unit = createInmate(FATTY);
        map->repMax = map->repMax + -0x3c;
        goto LAB_00103317;
      }
      break;
    case 'h':
      pWVar6 = win->footer;
      if (9 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"HOMEBOY ADDED");
        map->repMax = map->repMax + -10;
        unit = createInmate(HOMEBOY);
        goto LAB_00103317;
      }
      break;
    case 'l':
      pWVar6 = win->footer;
      if (0xf < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"LUNATIC ADDED");
        IVar1 = LUNATIC;
        goto LAB_00103240;
      }
      break;
    case 's':
      if (9 < map->repMax) {
        mvwprintw(win->footer,0,0x28,"SPEEDY ADDED");
        IVar1 = SPEEDY;
        goto LAB_001032d6;
      }
      goto LAB_001033dc;
    }
    pcVar4 = "INSUFICIENT FUNDS";
LAB_00103346:
    mvwprintw(pWVar6,0,0x28,pcVar4);
LAB_0010334d:
    if (map->repMax < 10) {
LAB_001033dc:
      mvwprintw(win->footer,0,0x14,"INSUFICIENT FUNDS");
      wrefresh(win->footer);
      wgetch(win->body);
LAB_00103405:
      for (iVar5 = 1; iVar5 != 0x4b; iVar5 = iVar5 + 1) {
        iVar7 = wmove(win->footer,0,iVar5);
        if (iVar7 != -1) {
          waddch(win->footer);
        }
      }
      for (iVar5 = 1; iVar5 != 0x4b; iVar5 = iVar5 + 1) {
        iVar7 = wmove(win->body,0x10,iVar5);
        if (iVar7 != -1) {
          waddch(win->body,0x20);
        }
      }
      wrefresh(win->footer);
      wrefresh(win->body);
      return;
    }
    if ((cVar2 == '\n') && (iVar5 == 0)) {
      mvwprintw(win->footer,0,0x1e,"Please select at least one unit");
      cVar2 = ' ';
    }
    else if (cVar2 == '\n') goto LAB_00103405;
    wrefresh(win->footer);
    for (iVar7 = 0x1e; iVar7 != 0x4b; iVar7 = iVar7 + 1) {
      iVar3 = wmove(win->footer,0,iVar7);
      if (iVar3 != -1) {
        waddch(win->footer);
      }
    }
    if ((cVar2 == '\n') || (4 < iVar5)) goto LAB_00103405;
  } while( true );
}

Assistant:

void drawInmateSelection(struct Windows *win, struct Map *map,
    struct UnitList *inmates, struct UnitList *guards) {
    struct Inmate *inmate;
    char input;
    int y;
    int numAdded = 0;
//
//    mvwprintw(win->body, MAP_ROWS, 3,
//        "Press the corresponding letter to buy inmate");
//    mvwprintw(win->footer, 0, 3, "Press \"Enter\" to play:");
    do {
        updateHeader(win->header, map);
        wrefresh(win->header);
        input = wgetch(win->body);
        switch (input) {
            case 'h':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "HOMEBOY ADDED");
                    map->repMax -= 10;
                    inmate = createInmate(input);
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'b':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "BRUISER ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'l':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "LUNATIC ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'f':
                if (map->repMax >= 60) {
                    mvwprintw(win->footer, 0, 40, "FATTY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 60;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 's':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "SPEEDY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                break;
            case 'c':
                if (map->repMax >= 20) {
                    mvwprintw(win->footer, 0, 40, "CUTIE ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 20;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'a':
                if (map->repMax >= 30) {
                    mvwprintw(win->footer, 0, 40, "ATTORNEY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 30;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'd':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "DOCTOR ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            default:
                mvwprintw(win->footer, 0, 40, "INMATE NOT FOUND");
        }
        if (map->repMax < 10) {
            mvwprintw(win->footer, 0, 20, "INSUFICIENT FUNDS");
            wrefresh(win->footer);
            wgetch(win->body);
            break;
        }
        if (input == '\n' && numAdded == 0) {
            mvwprintw(win->footer, 0, 30, "Please select at least one unit");
            input = ' ';
        }
        else if (input == '\n') {
            break;
        }
        wrefresh(win->footer);
        for (y = 30; y < MAX_COLS - 5; y++) {
            mvwaddch(win->footer, 0, y, ACS_HLINE);
        }
    } while (input != '\n' && numAdded < 5);
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->footer, 0, y, ACS_HLINE);
    }
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->body, MAP_ROWS, y, ' ');
    }
    wrefresh(win->footer);
    wrefresh(win->body);
}